

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_1::ShadersOOB::~ShadersOOB(ShadersOOB *this)

{
  ShadersOOB *this_local;
  
  ~ShadersOOB(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

ShadersOOB::~ShadersOOB (void)
{
	try
	{
		// Reset GL_CONTEXT_LOST error before destroying resources
		m_gl.getGraphicsResetStatus();
		teardown();
	}
	catch (...)
	{
		// Ignore GL errors from teardown()
	}
}